

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadServiceWrapperBase.cpp
# Opt level: O0

void __thiscall ThreadServiceWrapperBase::Shutdown(ThreadServiceWrapperBase *this)

{
  ThreadServiceWrapperBase *this_local;
  
  if ((this->hasScheduledIdleCollect & 1U) != 0) {
    this->inIdleCollect = true;
    FinishIdleCollect(this,FinishReasonNormal);
  }
  return;
}

Assistant:

void ThreadServiceWrapperBase::Shutdown()
{
    if (hasScheduledIdleCollect)
    {
#if DBG
        // Fake the inIdleCollect to get pass asserts in FinishIdleCollect
        inIdleCollect = true;
#endif
        FinishIdleCollect(FinishReason::FinishReasonNormal);
    }
}